

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UVector * __thiscall icu_63::RuleBasedTimeZone::copyRules(RuleBasedTimeZone *this,UVector *source)

{
  int32_t initialCapacity;
  UVector *this_00;
  long *plVar1;
  void *obj;
  int iVar2;
  bool bVar3;
  UErrorCode ec;
  UErrorCode local_2c;
  
  if (source != (UVector *)0x0) {
    local_2c = U_ZERO_ERROR;
    initialCapacity = source->count;
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)source);
    if (this_00 == (UVector *)0x0) {
      this_00 = (UVector *)0x0;
    }
    else {
      UVector::UVector(this_00,initialCapacity,&local_2c);
    }
    if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
      if (0 < initialCapacity) {
        iVar2 = 0;
        do {
          plVar1 = (long *)UVector::elementAt(source,iVar2);
          obj = (void *)(**(code **)(*plVar1 + 0x18))(plVar1);
          UVector::addElement(this_00,obj,&local_2c);
          if (U_ZERO_ERROR < local_2c) break;
          bVar3 = initialCapacity + -1 != iVar2;
          iVar2 = iVar2 + 1;
        } while (bVar3);
      }
      if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
        return this_00;
      }
      if (0 < this_00->count) {
        iVar2 = 0;
        do {
          plVar1 = (long *)UVector::orphanElementAt(this_00,iVar2);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))(plVar1);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < this_00->count);
      }
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
  }
  return (UVector *)0x0;
}

Assistant:

UVector*
RuleBasedTimeZone::copyRules(UVector* source) {
    if (source == NULL) {
        return NULL;
    }
    UErrorCode ec = U_ZERO_ERROR;
    int32_t size = source->size();
    UVector *rules = new UVector(size, ec);
    if (U_FAILURE(ec)) {
        return NULL;
    }
    int32_t i;
    for (i = 0; i < size; i++) {
        rules->addElement(((TimeZoneRule*)source->elementAt(i))->clone(), ec);
        if (U_FAILURE(ec)) {
            break;
        }
    }
    if (U_FAILURE(ec)) {
        // In case of error, clean up
        for (i = 0; i < rules->size(); i++) {
            TimeZoneRule *rule = (TimeZoneRule*)rules->orphanElementAt(i);
            delete rule;
        }
        delete rules;
        return NULL;
    }
    return rules;
}